

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPServer::getp_get_port
          (CVmObjHTTPServer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  undefined4 in_register_00000034;
  int port;
  char *ip;
  char *addr;
  
  if (getp_get_port(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_get_port(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_get_port::desc.min_argc_ = 0;
      getp_get_port::desc.opt_argc_ = 0;
      getp_get_port::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_port(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_get_port::desc);
  if (iVar1 == 0) {
    iVar1 = get_listener_addr(this,&addr,&ip,&port);
    if (iVar1 == 0) {
      retval->typ = VM_NIL;
    }
    else {
      retval->typ = VM_INT;
      (retval->val).intval = port;
      lib_free_str(addr);
      lib_free_str(ip);
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPServer::getp_get_port(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* return the port number */
    char *addr, *ip;
    int port;
    if (get_listener_addr(addr, ip, port))
    {
        retval->set_int(port);
        lib_free_str(addr);
        lib_free_str(ip);
    }
    else
        retval->set_nil();

    /* handled */
    return TRUE;
}